

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_hash.c
# Opt level: O2

void lyd_unlink_hash(lyd_node *node)

{
  lyd_node_inner *plVar1;
  lysc_node *plVar2;
  char *pcVar3;
  LY_ERR LVar4;
  uint32_t uVar5;
  size_t sVar6;
  lys_module *plVar7;
  undefined8 uVar8;
  lyd_node *node_local;
  
  plVar1 = node->parent;
  if (plVar1 == (lyd_node_inner *)0x0) {
    return;
  }
  if (node->schema == (lysc_node *)0x0) {
    return;
  }
  if ((plVar1->field_0).node.schema == (lysc_node *)0x0) {
    return;
  }
  if (plVar1->children_ht != (ly_ht *)0x0) {
    node_local = node;
    LVar4 = lyht_remove(plVar1->children_ht,&node_local,node->hash);
    plVar2 = node_local->schema;
    if (LVar4 == LY_SUCCESS) {
      if ((plVar2->nodetype & 0x18) == 0) {
        return;
      }
      if ((node_local->prev->next != (lyd_node *)0x0) && (node_local->prev->schema == plVar2)) {
        return;
      }
      pcVar3 = plVar2->module->name;
      sVar6 = strlen(pcVar3);
      uVar5 = lyht_hash_multi(0,pcVar3,sVar6);
      pcVar3 = node_local->schema->name;
      sVar6 = strlen(pcVar3);
      uVar5 = lyht_hash_multi(uVar5,pcVar3,sVar6);
      uVar5 = lyht_hash_multi(uVar5,(char *)0x0,0);
      LVar4 = lyht_remove(node_local->parent->children_ht,&node_local,uVar5);
      if (LVar4 == LY_SUCCESS) {
        if (node_local->next == (lyd_node *)0x0) {
          return;
        }
        if (node_local->next->schema != node_local->schema) {
          return;
        }
        LVar4 = lyht_insert(node_local->parent->children_ht,&node_local->next,uVar5,(void **)0x0);
        if (LVar4 == LY_SUCCESS) {
          return;
        }
        if (node_local->schema == (lysc_node *)0x0) {
          plVar7 = (lys_module *)&node_local[2].schema;
        }
        else {
          plVar7 = node_local->schema->module;
        }
        uVar8 = 0xe7;
      }
      else {
        if (node_local->schema == (lysc_node *)0x0) {
          plVar7 = (lys_module *)&node_local[2].schema;
        }
        else {
          plVar7 = node_local->schema->module;
        }
        uVar8 = 0xe0;
      }
    }
    else {
      if (plVar2 == (lysc_node *)0x0) {
        plVar7 = (lys_module *)&node_local[2].schema;
      }
      else {
        plVar7 = plVar2->module;
      }
      uVar8 = 0xd3;
    }
    ly_log(plVar7->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c"
           ,uVar8);
    return;
  }
  return;
}

Assistant:

void
lyd_unlink_hash(struct lyd_node *node)
{
    uint32_t hash;

    if (!node->parent || !node->schema || !node->parent->schema || !node->parent->children_ht) {
        /* not in any HT */
        return;
    }

    /* remove from the parent HT */
    if (lyht_remove(node->parent->children_ht, &node, node->hash)) {
        LOGINT(LYD_CTX(node));
        return;
    }

    /* first instance of the (leaf-)list, needs to be removed from HT */
    if ((node->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) && (!node->prev->next || (node->prev->schema != node->schema))) {
        /* get the simple hash */
        hash = lyht_hash_multi(0, node->schema->module->name, strlen(node->schema->module->name));
        hash = lyht_hash_multi(hash, node->schema->name, strlen(node->schema->name));
        hash = lyht_hash_multi(hash, NULL, 0);

        /* remove the instance */
        if (lyht_remove(node->parent->children_ht, &node, hash)) {
            LOGINT(LYD_CTX(node));
            return;
        }

        /* add the next instance */
        if (node->next && (node->next->schema == node->schema)) {
            if (lyht_insert(node->parent->children_ht, &node->next, hash, NULL)) {
                LOGINT(LYD_CTX(node));
                return;
            }
        }
    }
}